

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall QDockAreaLayoutInfo::indexOf(QDockAreaLayoutInfo *this,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  long i_00;
  qsizetype qVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  QDockAreaLayoutInfo *in_RDX;
  long in_RSI;
  QList<QDockAreaLayoutItem> *in_RDI;
  QDockAreaLayoutItem *item;
  int i;
  QList<int> *result;
  parameter_type t;
  QList<QDockAreaLayoutItem> *this_00;
  int local_30;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  iVar5 = 0;
  this_00 = in_RDI;
  do {
    i_00 = (long)iVar5;
    qVar3 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 0x40));
    if (qVar3 <= i_00) {
      memset(this_00,0,0x18);
      QList<int>::QList((QList<int> *)0x570af4);
      return (QList<int> *)in_RDI;
    }
    pQVar4 = QList<QDockAreaLayoutItem>::at(this_00,i_00);
    t = (parameter_type)((ulong)i_00 >> 0x20);
    if (pQVar4->placeHolderItem == (QPlaceHolderItem *)0x0) {
      if (pQVar4->subinfo == (QDockAreaLayoutInfo *)0x0) {
        if ((((pQVar4->flags & 1) == 0) && (pQVar4->widgetItem != (QLayoutItem *)0x0)) &&
           (iVar2 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])(),
           (QDockAreaLayoutInfo *)CONCAT44(extraout_var,iVar2) == in_RDX)) {
          (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (this_00->d).ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
          (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QList<int>::QList((QList<int> *)0x570a99);
          QList<int>::operator<<((QList<int> *)this_00,t);
          return (QList<int> *)in_RDI;
        }
      }
      else {
        (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (this_00->d).ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
        (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        indexOf(in_RDX,(QWidget *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
        bVar1 = QList<int>::isEmpty((QList<int> *)0x5709ec);
        if (bVar1) {
          local_30 = 4;
          QList<int>::~QList((QList<int> *)0x570a26);
        }
        else {
          QList<int>::prepend((QList<int> *)0x5709fe,t);
          local_30 = 1;
        }
        if (local_30 == 1) {
          return (QList<int> *)in_RDI;
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOf(const QWidget *widget) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.placeHolderItem != nullptr)
            continue;

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOf(widget);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (!(item.flags & QDockAreaLayoutItem::GapItem) && item.widgetItem && item.widgetItem->widget() == widget) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}